

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O2

PersonHandle * __thiscall
mbc::Val::MessageBook::sreach
          (PersonHandle *__return_storage_ptr__,MessageBook *this,string *thing,string *attr_)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
  *pmVar1;
  Person *this_00;
  PersonHandle *pPVar2;
  __type_conflict _Var3;
  int iVar4;
  _ValAtom *p_Var5;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  string local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
  local_78;
  string *local_50;
  string *local_48;
  MessageBook *local_40;
  PersonHandle *local_38;
  
  pmVar1 = this->persons_;
  local_50 = attr_;
  local_48 = thing;
  local_40 = this;
  local_38 = __return_storage_ptr__;
  for (p_Var6 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_true>
              (&local_78,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
                *)(p_Var6 + 1));
    this_00 = local_78.second;
    std::__cxx11::string::string((string *)&local_98,(string *)local_50);
    p_Var5 = Person::attr(this_00,&local_98);
    iVar4 = (*(p_Var5->super_ValBase)._vptr_ValBase[4])(p_Var5);
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var,iVar4),local_48);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    if (_Var3) break;
  }
  pPVar2 = local_38;
  if ((_Rb_tree_header *)p_Var6 == &(local_40->persons_->_M_t)._M_impl.super__Rb_tree_header) {
    newPerson(local_38,local_40);
  }
  else {
    PersonHandle::PersonHandle(local_38,local_40,*(Person **)(p_Var6 + 2));
  }
  return pPVar2;
}

Assistant:

PersonHandle MessageBook::sreach(string thing, string attr_) {
    auto it = std::find_if(persons_ -> begin(), persons_ -> end(),
            [&](const std::pair<string, Person*>& pair) {
                return pair.second -> attr(attr_) -> raw() == thing;
            });
    if(it != persons_ -> end()) {
        return PersonHandle(this, it -> second);
    } else {
        return newPerson();
        // throw "the result of sreach is too little";
    }
}